

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O2

rbtree_node_base * eastl::RBTreeIncrement(rbtree_node_base *pNode)

{
  rbtree_node_base *prVar1;
  rbtree_node_base *prVar2;
  
  prVar2 = pNode->mpNodeRight;
  if (prVar2 == (rbtree_node_base *)0x0) {
    do {
      prVar2 = pNode;
      pNode = prVar2->mpNodeParent;
    } while (prVar2 == pNode->mpNodeRight);
    if (prVar2->mpNodeRight == pNode) {
      pNode = prVar2;
    }
    return pNode;
  }
  do {
    prVar1 = prVar2;
    prVar2 = prVar2->mpNodeLeft;
  } while (prVar2 != (this_type *)0x0);
  return prVar1;
}

Assistant:

EASTL_API rbtree_node_base* RBTreeIncrement(const rbtree_node_base* pNode)
    {
        if(pNode->mpNodeRight) 
        {
            pNode = pNode->mpNodeRight;

            while(pNode->mpNodeLeft)
                pNode = pNode->mpNodeLeft;
        }
        else 
        {
            rbtree_node_base* pNodeTemp = pNode->mpNodeParent;

            while(pNode == pNodeTemp->mpNodeRight) 
            {
                pNode = pNodeTemp;
                pNodeTemp = pNodeTemp->mpNodeParent;
            }

            if(pNode->mpNodeRight != pNodeTemp)
                pNode = pNodeTemp;
        }

        return const_cast<rbtree_node_base*>(pNode);
    }